

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbs.cc
# Opt level: O2

int cbs_get_u(CBS *cbs,uint64_t *out,size_t len)

{
  uint8_t *puVar1;
  int iVar2;
  ulong uVar3;
  size_t sVar4;
  
  iVar2 = 0;
  if (len <= cbs->len) {
    puVar1 = cbs->data;
    cbs->data = puVar1 + len;
    cbs->len = cbs->len - len;
    uVar3 = 0;
    for (sVar4 = 0; len != sVar4; sVar4 = sVar4 + 1) {
      uVar3 = uVar3 << 8 | (ulong)puVar1[sVar4];
    }
    *out = uVar3;
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

static int cbs_get(CBS *cbs, const uint8_t **p, size_t n) {
  if (cbs->len < n) {
    return 0;
  }

  *p = cbs->data;
  cbs->data += n;
  cbs->len -= n;
  return 1;
}